

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::files_checked(torrent *this)

{
  ulong uVar1;
  peer_connection *this_00;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01
  ;
  element_type *peVar5;
  vector<peer_connection_*> *this_02;
  reference pppVar6;
  EVP_PKEY_CTX *ctx;
  peer_connection *pc;
  iterator __end2_1;
  iterator __begin2_1;
  vector<peer_connection_*> *__range2_1;
  bool notify_initialized;
  shared_ptr<libtorrent::torrent_plugin> *ext;
  iterator __end2;
  iterator __begin2;
  list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
  *__range2;
  uchar local_11;
  torrent *local_10;
  torrent *this_local;
  
  local_10 = this;
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    if ((*(uint *)&this->field_0x600 & 1) != 0) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
    bVar2 = is_seed(this);
    if (bVar2) {
      this->field_0x606 = this->field_0x606 | 0x40;
      tracker_list::set_complete_sent(&this->m_trackers);
      if ((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
           != 4) &&
         (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
          != 5)) {
        finished(this);
      }
    }
    else {
      if (((byte)this->field_0x5cc >> 3 & 1) != 0) {
        this->field_0x5cc = this->field_0x5cc & 0xf7;
        local_11 = '@';
        set_need_save_resume(this,(resume_data_flags_t)0x40);
        state_updated(this);
      }
      if ((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
           != 4) && (bVar2 = is_finished(this), bVar2)) {
        finished(this);
      }
    }
    if (((((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
          != 4) &&
        (((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) & 7)
         != 5)) && (((byte)this->field_0x5cc >> 2 & 1) == 0)) {
      set_state(this,downloading);
    }
    iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    bVar2 = alert_manager::should_post<libtorrent::torrent_checked_alert>
                      ((alert_manager *)CONCAT44(extraout_var,iVar3));
    if (bVar2) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)&stack0xffffffffffffffd8);
      alert_manager::emplace_alert<libtorrent::torrent_checked_alert,libtorrent::torrent_handle>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar3),
                 (torrent_handle *)&stack0xffffffffffffffd8);
      torrent_handle::~torrent_handle((torrent_handle *)&stack0xffffffffffffffd8);
    }
    __end2 = ::std::__cxx11::
             list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
             ::begin(&this->m_extensions);
    ext = (shared_ptr<libtorrent::torrent_plugin> *)
          ::std::__cxx11::
          list<std::shared_ptr<libtorrent::torrent_plugin>,_std::allocator<std::shared_ptr<libtorrent::torrent_plugin>_>_>
          ::end(&this->m_extensions);
    while (bVar2 = ::std::operator!=(&__end2,(_Self *)&ext), bVar2) {
      this_01 = (__shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator*
                             (&__end2);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_01);
      (*peVar5->_vptr_torrent_plugin[8])();
      ::std::_List_iterator<std::shared_ptr<libtorrent::torrent_plugin>_>::operator++(&__end2);
    }
    uVar1 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xfffffffffdffffff | 0x2000000;
    this->field_0x5c0 = this->field_0x5c0 & 0xf7 | 8;
    update_want_tick(this);
    this_02 = &(this->super_torrent_hot_members).m_connections;
    __end2_1 = ::std::
               vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ::begin(&this_02->
                        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      );
    pc = (peer_connection *)
         ::std::
         vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
         ::end(&this_02->
                super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              );
    while( true ) {
      ctx = (EVP_PKEY_CTX *)&pc;
      bVar2 = __gnu_cxx::operator!=
                        (&__end2_1,
                         (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                          *)ctx);
      if (!bVar2) break;
      pppVar6 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end2_1);
      this_00 = *pppVar6;
      if ((((byte)(uVar1 >> 0x19) & 1 ^ 0xff) & 1) == 0) {
LAB_006746bd:
        peer_connection::peer_log(this_00,info,"ON_FILES_CHECKED");
        bVar2 = peer_connection::is_interesting(this_00);
        if (((bVar2) && (bVar2 = peer_connection::has_peer_choked(this_00), !bVar2)) &&
           (bVar2 = request_a_block(this,this_00), bVar2)) {
          inc_stats_counter(this,0x1c,1);
          peer_connection::send_block_requests(this_00);
        }
      }
      else {
        uVar4 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
        if ((uVar4 & 1) == 0) {
          peer_connection::on_metadata_impl(this_00);
          uVar4 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
          if ((uVar4 & 1) == 0) {
            peer_connection::init(this_00,ctx);
            goto LAB_006746bd;
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end2_1);
    }
    start_announcing(this);
    maybe_connect_web_seeds(this);
  }
  else {
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"files_checked(), paused");
  }
  return;
}

Assistant:

void torrent::files_checked()
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_torrent_file->is_valid());

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("files_checked(), paused");
#endif
			return;
		}

		// calling pause will also trigger the auto managed
		// recalculation
		// if we just got here by downloading the metadata,
		// just keep going, no need to disconnect all peers just
		// to restart the torrent in a second
		if (m_auto_managed)
		{
			// if this is an auto managed torrent, force a recalculation
			// of which torrents to have active
			m_ses.trigger_auto_manage();
		}

		if (!is_seed())
		{
#ifndef TORRENT_DISABLE_SUPERSEEDING
			// turn off super seeding if we're not a seed
			if (m_super_seeding)
			{
				m_super_seeding = false;
				set_need_save_resume(torrent_handle::if_state_changed);
				state_updated();
			}
#endif

			if (m_state != torrent_status::finished && is_finished())
				finished();
		}
		else
		{
			// we just added this torrent as a seed, or force-rechecked it, and we
			// have all of it. Assume that we sent the event=completed when we
			// finished downloading it, and don't send any more.
			m_complete_sent = true;
			m_trackers.set_complete_sent();

			if (m_state != torrent_status::finished
				&& m_state != torrent_status::seeding)
				finished();
		}

		// we might be finished already, in which case we should
		// not switch to downloading mode. If all files are
		// filtered, we're finished when we start.
		if (m_state != torrent_status::finished
			&& m_state != torrent_status::seeding
			&& !m_seed_mode)
		{
			set_state(torrent_status::downloading);
		}

		INVARIANT_CHECK;

		if (m_ses.alerts().should_post<torrent_checked_alert>())
		{
			m_ses.alerts().emplace_alert<torrent_checked_alert>(
				get_handle());
		}

#ifndef TORRENT_DISABLE_EXTENSIONS
		for (auto& ext : m_extensions)
		{
			ext->on_files_checked();
		}
#endif

		bool const notify_initialized = !m_connections_initialized;
		m_connections_initialized = true;
		m_files_checked = true;

		update_want_tick();

		for (auto* pc : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			// all peer connections have to initialize themselves now that the metadata
			// is available
			if (notify_initialized)
			{
				if (pc->is_disconnecting()) continue;
				pc->on_metadata_impl();
				if (pc->is_disconnecting()) continue;
				pc->init();
			}

#ifndef TORRENT_DISABLE_LOGGING
			pc->peer_log(peer_log_alert::info, "ON_FILES_CHECKED");
#endif
			if (pc->is_interesting() && !pc->has_peer_choked())
			{
				if (request_a_block(*this, *pc))
				{
					inc_stats_counter(counters::unchoke_piece_picks);
					pc->send_block_requests();
				}
			}
		}

		start_announcing();

		maybe_connect_web_seeds();
	}